

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::assessPhase1OptimalityUnperturbed(HEkkDual *this)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  long in_RDI;
  HEkkDual *in_stack_00000010;
  HighsInt num_lp_dual_infeasibilities;
  double *dual_objective_value;
  HighsModelStatus *model_status;
  HighsSimplexInfo *info;
  HEkk *in_stack_00000040;
  
  lVar2 = *(long *)(in_RDI + 0x10);
  pdVar3 = (double *)(*(long *)(in_RDI + 0x10) + 0x2948);
  if (*(int *)(in_RDI + 0x710) == 0) {
    dVar1 = *pdVar3;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      highsLogDev((HighsLogOptions *)*pdVar3,
                  (HighsLogType)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),(char *)0x1,
                  "LP is dual feasible wrt Phase 1 bounds after removing cost perturbations: dual objective is %10.4g\n"
                 );
      HEkk::computeSimplexLpDualInfeasible(in_stack_00000040);
      if (*(int *)(*(long *)(in_RDI + 0x10) + 0x1d0) == 0) {
        highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kInfo,
                    "LP is dual feasible wrt Phase 2 bounds after removing cost perturbations so go to phase 2\n"
                   );
        *(undefined4 *)(in_RDI + 0xe4) = 2;
      }
      else {
        reportOnPossibleLpDualInfeasibility(in_stack_00000010);
        *(undefined4 *)(lVar2 + 0x2970) = 9;
        *(undefined4 *)(in_RDI + 0xe4) = 0xfffffffe;
      }
    }
    else {
      highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kInfo,
                  "LP is dual feasible wrt Phase 2 bounds after removing cost perturbations so go to phase 2\n"
                 );
      *(undefined4 *)(in_RDI + 0xe4) = 2;
    }
  }
  else {
    highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kInfo,
                "LP has %d dual feasibilities wrt Phase 1 bounds after removing cost perturbations so return to phase 1\n"
                ,(ulong)*(uint *)(in_RDI + 0x710));
  }
  return;
}

Assistant:

void HEkkDual::assessPhase1OptimalityUnperturbed() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsModelStatus& model_status = ekk_instance_.model_status_;
  double& dual_objective_value = info.dual_objective_value;
  assert(!info.costs_perturbed);
  if (dualInfeasCount == 0) {
    // No dual infeasibilities with respect to phase 1 bounds.
    if (dual_objective_value == 0) {
      // No dual infeasibilities with respect to phase 2 bounds so
      // go to phase 2
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                  "LP is dual feasible wrt Phase 2 bounds after removing cost "
                  "perturbations so go to phase 2\n");
      solve_phase = kSolvePhase2;
    } else {
      // Nonzero dual objective value: could be insignificant dual
      // infeasibilities
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                  "LP is dual feasible wrt Phase 1 bounds after removing cost "
                  "perturbations: "
                  "dual objective is %10.4g\n",
                  dual_objective_value);
      ekk_instance_.computeSimplexLpDualInfeasible();
      const HighsInt num_lp_dual_infeasibilities =
          ekk_instance_.analysis_.num_dual_phase_1_lp_dual_infeasibility;
      if (num_lp_dual_infeasibilities == 0) {
        highsLogDev(
            ekk_instance_.options_->log_options, HighsLogType::kInfo,
            "LP is dual feasible wrt Phase 2 bounds after removing cost "
            "perturbations so go to phase 2\n");
        solve_phase = kSolvePhase2;
      } else {
        // LP is dual infeasible if the dual objective is sufficiently
        // negative, so no conclusions on the primal LP can be deduced
        // - could be primal unbounded or primal infeasible.
        //
        // Indicate the conclusion of dual infeasibility by setting
        // the scaled model status
        reportOnPossibleLpDualInfeasibility();
        model_status = HighsModelStatus::kUnboundedOrInfeasible;
        solve_phase = kSolvePhaseExit;
      }
    }
  } else {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "LP has %d dual feasibilities wrt Phase 1 bounds after "
                "removing cost perturbations "
                "so return to phase 1\n",
                dualInfeasCount);
    assert(solve_phase == kSolvePhase1);
  }
}